

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

bool_t prf_texture_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint16_t uVar1;
  uint uVar2;
  int32_t iVar3;
  uint uVar4;
  void *pvVar5;
  int iVar6;
  bfile_t *in_RDX;
  long *in_RSI;
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict11 *data;
  int pos;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  uint n_bytes;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar7;
  
  n_bytes = 4;
  uVar1 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
  *in_RDI = uVar1;
  if (*in_RDI == prf_texture_info.opcode) {
    uVar1 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
    in_RDI[1] = uVar1;
    if ((*(long *)(in_RDI + 4) == 0) && (4 < in_RDI[1])) {
      if (*(short *)(*in_RSI + 8) == 0) {
        pvVar5 = malloc((long)(int)(in_RDI[1] - 4));
        *(void **)(in_RDI + 4) = pvVar5;
      }
      else {
        pvVar5 = pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
        *(void **)(in_RDI + 4) = pvVar5;
      }
      if (*(long *)(in_RDI + 4) == 0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        bf_rewind(in_RDX,n_bytes);
        return 0;
      }
    }
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    if ((int)(n_bytes + 200) <= (int)(uint)in_RDI[1]) {
      bf_read(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
              ,(uint)((ulong)in_RDI >> 0x20));
      uVar2 = n_bytes + 200;
      iVar6 = n_bytes + 0xcc;
      n_bytes = uVar2;
      if (iVar6 <= (int)(uint)in_RDI[1]) {
        iVar3 = bf_get_int32_be(bfile_00);
        *(int32_t *)&bfile_00[2].filename = iVar3;
        uVar4 = uVar2 + 4;
        n_bytes = uVar4;
        if ((int)(uVar2 + 8) <= (int)(uint)in_RDI[1]) {
          iVar3 = bf_get_int32_be(bfile_00);
          *(int32_t *)((long)&bfile_00[2].filename + 4) = iVar3;
          n_bytes = uVar4 + 4;
          if ((int)(uVar4 + 8) <= (int)(uint)in_RDI[1]) {
            iVar3 = bf_get_int32_be(bfile_00);
            *(int32_t *)&bfile_00[2].buffer = iVar3;
            n_bytes = n_bytes + 4;
          }
        }
      }
    }
    if ((int)n_bytes < (int)(uint)in_RDI[1]) {
      bf_read(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
              ,(uint)((ulong)in_RDI >> 0x20));
    }
    bVar7 = 1;
  }
  else {
    prf_error(9,"tried to use texture load method on node of type %d.",(ulong)*in_RDI);
    bf_rewind(in_RDX,n_bytes);
    bVar7 = 0;
  }
  return bVar7;
}

Assistant:

static bool_t
prf_texture_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile)
{
    int pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_texture_info.opcode ) {
        prf_error( 9, "tried to use texture load method on node of type %d.",
                   node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }
    node->length = bf_get_uint16_be( bfile );

    if ( node->data == NULL && node->length > 4 ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data =
                (uint8_t *) malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data =
                (uint8_t *) pool_malloc( state->model->mempool_id,
                                         node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }
  
    do {
        node_data * data = (node_data *) node->data;
        if ( node->length < (pos + 200) ) break;
        bf_read( bfile, (unsigned char*) data->filename, 200 ); pos += 200;
        if ( node->length < (pos + 4) ) break;
        data->pattern_index = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->x_location = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->y_location = bf_get_int32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
                        node->length - pos );
    return TRUE;
}